

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()
          (MacOSXContentGeneratorType *this,cmSourceFile *source,char *pkgloc)

{
  bool bVar1;
  cmTarget *this_00;
  string *psVar2;
  cmLocalNinjaGenerator *pcVar3;
  cmGlobalNinjaGenerator *pcVar4;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [8];
  string output;
  undefined1 local_60 [8];
  string input;
  string macdir;
  char *pkgloc_local;
  cmSourceFile *source_local;
  MacOSXContentGeneratorType *this_local;
  
  this_00 = GetTarget(this->Generator);
  bVar1 = cmTarget::IsBundleOnApple(this_00);
  if (bVar1) {
    cmOSXBundleGenerator::InitMacOSXContentDirectory_abi_cxx11_
              ((string *)((long)&input.field_2 + 8),this->Generator->OSXBundleGenerator,pkgloc);
    psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    std::__cxx11::string::string((string *)local_60,(string *)psVar2);
    pcVar3 = GetLocalGenerator(this->Generator);
    cmLocalNinjaGenerator::ConvertToNinjaPath
              ((string *)((long)&output.field_2 + 8),pcVar3,(string *)local_60);
    std::__cxx11::string::operator=((string *)local_60,(string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_b0,(string *)(input.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_b0,"/");
    cmsys::SystemTools::GetFilenameName(&local_d0,(string *)local_60);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    pcVar3 = GetLocalGenerator(this->Generator);
    cmLocalNinjaGenerator::ConvertToNinjaPath(&local_f0,pcVar3,(string *)local_b0);
    std::__cxx11::string::operator=((string *)local_b0,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    pcVar4 = GetGlobalGenerator(this->Generator);
    cmGlobalNinjaGenerator::WriteMacOSXContentBuild(pcVar4,(string *)local_60,(string *)local_b0);
    pcVar4 = GetGlobalGenerator(this->Generator);
    cmGlobalNinjaGenerator::AddDependencyToAll(pcVar4,(string *)local_b0);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(input.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void
cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()(
  cmSourceFile const& source, const char* pkgloc)
{
  // Skip OS X content when not building a Framework or Bundle.
  if(!this->Generator->GetTarget()->IsBundleOnApple())
    {
    return;
    }

  std::string macdir =
    this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(pkgloc);

  // Get the input file location.
  std::string input = source.GetFullPath();
  input =
    this->Generator->GetLocalGenerator()->ConvertToNinjaPath(input);

  // Get the output file location.
  std::string output = macdir;
  output += "/";
  output += cmSystemTools::GetFilenameName(input);
  output =
    this->Generator->GetLocalGenerator()->ConvertToNinjaPath(output);

  // Write a build statement to copy the content into the bundle.
  this->Generator->GetGlobalGenerator()->WriteMacOSXContentBuild(input,
                                                                 output);

  // Add as a dependency of all target so that it gets called.
  this->Generator->GetGlobalGenerator()->AddDependencyToAll(output);
}